

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O2

int acmod_read_scores_internal(acmod_t *acmod)

{
  FILE *__stream;
  int16 *piVar1;
  int iVar2;
  undefined8 in_RAX;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int16 n_active;
  
  n_active = (int16)((ulong)in_RAX >> 0x30);
  __stream = (FILE *)acmod->insenfh;
  if (acmod->n_feat_frame == acmod->n_feat_alloc) {
    if (acmod->grow_feat == '\0') {
      return 0;
    }
    acmod_grow_feat_buf(acmod,acmod->n_feat_frame * 2);
  }
  if (__stream == (FILE *)0x0) {
    return -1;
  }
  sVar3 = fread(&n_active,2,1,__stream);
  if (sVar3 == 1) {
    acmod->n_senone_active = (int)n_active;
    if (acmod->mdef->n_sen == (int)n_active) {
      sVar3 = fread(acmod->senone_scores,2,(long)n_active,__stream);
      if (sVar3 == (long)acmod->n_senone_active) {
        return 1;
      }
    }
    else {
      sVar3 = fread(acmod->senone_active,1,(long)n_active,__stream);
      if (sVar3 == (long)acmod->n_senone_active) {
        lVar5 = 0;
        uVar4 = 0;
        do {
          if (acmod->n_senone_active <= lVar5) {
            iVar2 = acmod->mdef->n_sen;
            while (uVar4 = uVar4 + 1, (int)uVar4 < iVar2) {
              acmod->senone_scores[uVar4] = 0x7fff;
            }
            return 1;
          }
          piVar1 = acmod->senone_scores;
          uVar6 = (ulong)((int)uVar4 + (uint)acmod->senone_active[lVar5]);
          while (uVar4 = uVar4 + 1, uVar4 < uVar6) {
            piVar1[uVar4] = 0x7fff;
          }
          sVar3 = fread(piVar1 + uVar6,2,1,__stream);
          lVar5 = lVar5 + 1;
          uVar4 = uVar6;
        } while (sVar3 == 1);
      }
    }
  }
  iVar2 = ferror(__stream);
  if (iVar2 == 0) {
    return 0;
  }
  err_msg_system(ERR_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                 ,0x3d0,"Failed to read frame from senone file");
  return -1;
}

Assistant:

static int
acmod_read_scores_internal(acmod_t *acmod)
{
    FILE *senfh = acmod->insenfh;
    int16 n_active;
    size_t rv;

    if (acmod->n_feat_frame == acmod->n_feat_alloc) {
        if (acmod->grow_feat)
            acmod_grow_feat_buf(acmod, acmod->n_feat_alloc * 2);
        else
            return 0;
    }

    if (senfh == NULL)
        return -1;
    
    if ((rv = fread(&n_active, 2, 1, senfh)) != 1)
        goto error_out;

    acmod->n_senone_active = n_active;
    if (acmod->n_senone_active == bin_mdef_n_sen(acmod->mdef)) {
        if ((rv = fread(acmod->senone_scores, 2,
                        acmod->n_senone_active, senfh))
            != (size_t) acmod->n_senone_active)
            goto error_out;
    }
    else {
        int i, n;
        
        if ((rv = fread(acmod->senone_active, 1,
                        acmod->n_senone_active, senfh))
            != (size_t) acmod->n_senone_active)
            goto error_out;

        for (i = 0, n = 0; i < acmod->n_senone_active; ++i) {
            int j, sen = n + acmod->senone_active[i];
            for (j = n + 1; j < sen; ++j)
                acmod->senone_scores[j] = SENSCR_DUMMY;
            
            if ((rv = fread(acmod->senone_scores + sen, 2, 1, senfh)) != 1)
                goto error_out;
            
            n = sen;
        }

        n++;
        while (n < bin_mdef_n_sen(acmod->mdef))
            acmod->senone_scores[n++] = SENSCR_DUMMY;
    }
    return 1;

error_out:
    if (ferror(senfh)) {
        E_ERROR_SYSTEM("Failed to read frame from senone file");
        return -1;
    }
    return 0;
}